

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O1

ssize_t __thiscall
gvr::anon_unknown_3::PLYValueUInt8::write(PLYValueUInt8 *this,int __fd,void *__buf,size_t __n)

{
  uint uVar1;
  ssize_t sVar2;
  undefined4 in_register_00000034;
  long *plVar3;
  float in_XMM0_Da;
  
  plVar3 = (long *)CONCAT44(in_register_00000034,__fd);
  uVar1 = (uint)in_XMM0_Da;
  this->value = (uchar)uVar1;
  if ((uchar *)plVar3[5] < (uchar *)plVar3[6]) {
    *(uchar *)plVar3[5] = (uchar)uVar1;
    plVar3[5] = plVar3[5] + 1;
    return (ulong)uVar1;
  }
  sVar2 = (**(code **)(*plVar3 + 0x68))(plVar3,uVar1 & 0xff,__buf,*(code **)(*plVar3 + 0x68));
  return sVar2;
}

Assistant:

void write(std::streambuf *out, float v) { value=static_cast<unsigned char>(v); out->sputc(static_cast<char>(value)); }